

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountTestInstance::bindDescriptorSets
          (VaryingOutputCountTestInstance *this,DeviceInterface *vk,VkDevice device,
          Allocator *memAlloc,VkCommandBuffer *cmdBuffer,VkPipelineLayout *pipelineLayout)

{
  deInt32 dVar1;
  VkSampler VVar2;
  VkImageView obj;
  undefined8 *puVar3;
  Allocation *pAVar4;
  VkBuffer VVar5;
  VkDeviceSize VVar6;
  VkDeviceSize VVar7;
  VkImageView VVar8;
  undefined8 uVar9;
  VkSharingMode VVar10;
  VkResult result;
  DescriptorSetUpdateBuilder *pDVar11;
  VkSamplerCreateInfo *this_00;
  VkBuffer VVar12;
  VkDescriptorBufferInfo bufferDescriptorInfo;
  pointer pVStack_140;
  pointer local_130;
  pointer local_128;
  pointer local_118;
  VkDescriptorImageInfo descriptorImageInfo;
  VkAllocationCallbacks *pVStack_f0;
  VkSamplerCreateInfo samplerParams;
  TextureFormat texFormat;
  VkBufferCreateInfo bufferCreateInfo;
  
  if (this->m_test == READ_TEXTURE) {
    texFormat = glu::mapGLInternalFormat(0x8058);
    VVar10 = ::vk::mapTextureFormat(&texFormat);
    samplerParams.pNext = (void *)0x0;
    samplerParams.compareEnable = 0;
    samplerParams.compareOp = VK_COMPARE_OP_NEVER;
    samplerParams.minLod = 0.0;
    samplerParams.maxLod = 0.0;
    samplerParams.borderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    samplerParams.unnormalizedCoordinates = 0;
    samplerParams.flags = 0;
    samplerParams.magFilter = VK_FILTER_NEAREST;
    samplerParams.minFilter = VK_FILTER_NEAREST;
    samplerParams.mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
    samplerParams.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
    samplerParams._4_4_ = 0;
    samplerParams.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    samplerParams.addressModeV = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    samplerParams.addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    samplerParams.mipLodBias = 0.0;
    samplerParams.anisotropyEnable = 0;
    samplerParams.maxAnisotropy = 1.0;
    ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)&bufferDescriptorInfo,vk,device,
                        &samplerParams,(VkAllocationCallbacks *)0x0);
    VVar7 = bufferDescriptorInfo.range;
    VVar6 = bufferDescriptorInfo.offset;
    VVar12 = bufferDescriptorInfo.buffer;
    bufferCreateInfo._16_8_ = bufferDescriptorInfo.range;
    bufferCreateInfo.size = (VkDeviceSize)pVStack_140;
    bufferCreateInfo._0_8_ = bufferDescriptorInfo.buffer.m_internal;
    bufferCreateInfo.pNext = (void *)bufferDescriptorInfo.offset;
    bufferDescriptorInfo.buffer.m_internal = 0;
    bufferDescriptorInfo.offset = 0;
    bufferDescriptorInfo.range = 0;
    VVar2.m_internal =
         (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
    if (VVar2.m_internal == 0) {
      (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device =
           (VkDevice)VVar7;
      (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)pVStack_140;
      (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal =
           VVar12.m_internal;
      (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)VVar6;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()
                (&(this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter,
                 VVar2);
      (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device =
           (VkDevice)bufferCreateInfo._16_8_;
      (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)bufferCreateInfo.size;
      (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal =
           bufferCreateInfo._0_8_;
      (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface
           = (DeviceInterface *)bufferCreateInfo.pNext;
      if (bufferDescriptorInfo.buffer.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)20>_> *)&bufferDescriptorInfo.offset,
                   (VkSampler)bufferDescriptorInfo.buffer.m_internal);
      }
    }
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo._16_8_ = bufferCreateInfo._16_8_ & 0xffffffff00000000;
    bufferCreateInfo.size =
         (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    bufferCreateInfo.usage = 1;
    bufferCreateInfo.queueFamilyIndexCount = 3;
    bufferCreateInfo._44_4_ = 4;
    bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x600000005;
    bufferCreateInfo.sharingMode = VVar10;
    ::vk::createImageView
              ((Move<vk::Handle<(vk::HandleType)13>_> *)&descriptorImageInfo,vk,device,
               (VkImageViewCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
    uVar9 = descriptorImageInfo._16_8_;
    VVar8 = descriptorImageInfo.imageView;
    VVar2 = descriptorImageInfo.sampler;
    bufferDescriptorInfo.range = descriptorImageInfo._16_8_;
    bufferDescriptorInfo.buffer.m_internal = descriptorImageInfo.sampler.m_internal;
    bufferDescriptorInfo.offset = descriptorImageInfo.imageView.m_internal;
    descriptorImageInfo.sampler.m_internal = 0;
    descriptorImageInfo.imageView.m_internal = 0;
    descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    descriptorImageInfo._20_4_ = 0;
    obj.m_internal =
         (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
    ;
    if (obj.m_internal == 0) {
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)uVar9;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
           = pVStack_f0;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
           VVar2.m_internal;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)VVar8.m_internal;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 obj);
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)bufferDescriptorInfo.range;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
           = pVStack_f0;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
           bufferDescriptorInfo.buffer.m_internal;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)bufferDescriptorInfo.offset;
      if (descriptorImageInfo.sampler.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&descriptorImageInfo.imageView,
                   (VkImageView)descriptorImageInfo.sampler.m_internal);
      }
    }
    descriptorImageInfo.imageView.m_internal =
         (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
    ;
    descriptorImageInfo.sampler.m_internal =
         (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
    descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&bufferDescriptorInfo);
    pDVar11 = (DescriptorSetUpdateBuilder *)
              ::vk::DescriptorSetUpdateBuilder::write
                        ((DescriptorSetUpdateBuilder *)&bufferDescriptorInfo,
                         (int)(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>
                              .m_data.object.m_internal,(void *)0x0,0);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar11,vk,device);
    if (local_128 != (pointer)0x0) {
      operator_delete(local_128,(long)local_118 - (long)local_128);
    }
    if (pVStack_f0 != (VkAllocationCallbacks *)0x0) {
      operator_delete(pVStack_f0,(long)local_130 - (long)pVStack_f0);
    }
    this_00 = (VkSamplerCreateInfo *)&bufferDescriptorInfo;
  }
  else {
    if (this->m_test != READ_UNIFORM) {
      return;
    }
    dVar1 = this->m_maxEmitCount;
    makeBufferCreateInfo(&bufferCreateInfo,0x10,0x10);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferDescriptorInfo,vk,device,
                       &bufferCreateInfo,(VkAllocationCallbacks *)0x0);
    VVar7 = bufferDescriptorInfo.range;
    VVar6 = bufferDescriptorInfo.offset;
    VVar5 = bufferDescriptorInfo.buffer;
    samplerParams.flags = (undefined4)bufferDescriptorInfo.range;
    samplerParams.magFilter = bufferDescriptorInfo.range._4_4_;
    samplerParams._24_8_ = pVStack_140;
    samplerParams._0_8_ = bufferDescriptorInfo.buffer.m_internal;
    samplerParams.pNext = (void *)bufferDescriptorInfo.offset;
    bufferDescriptorInfo.buffer.m_internal = 0;
    bufferDescriptorInfo.offset = 0;
    bufferDescriptorInfo.range = 0;
    VVar12.m_internal =
         (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    if (VVar12.m_internal == 0) {
      (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)VVar7;
      (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)pVStack_140;
      (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           VVar5.m_internal;
      (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)VVar6;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&(this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 VVar12);
      (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)samplerParams._16_8_;
      (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)samplerParams._24_8_;
      (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           samplerParams._0_8_;
      (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)samplerParams.pNext;
      if (bufferDescriptorInfo.buffer.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&bufferDescriptorInfo.offset,
                   bufferDescriptorInfo.buffer);
      }
    }
    ::vk::getBufferMemoryRequirements
              ((VkMemoryRequirements *)&samplerParams,vk,device,
               (VkBuffer)
               (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
    (*memAlloc->_vptr_Allocator[3])(&bufferDescriptorInfo,memAlloc,&samplerParams,1);
    VVar5 = bufferDescriptorInfo.buffer;
    bufferDescriptorInfo.buffer.m_internal = 0;
    VVar12.m_internal =
         (deUint64)
         (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
         m_data.ptr;
    if (VVar12.m_internal != VVar5.m_internal) {
      if ((Allocation *)VVar12.m_internal == (Allocation *)0x0) {
        (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)VVar5.m_internal;
        VVar12 = VVar5;
      }
      else {
        (*((Allocation *)VVar12.m_internal)->_vptr_Allocation[1])();
        (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)VVar5.m_internal;
        VVar12 = VVar5;
        if (bufferDescriptorInfo.buffer.m_internal != 0) {
          (**(code **)(*(long *)bufferDescriptorInfo.buffer.m_internal + 8))();
          VVar12.m_internal =
               (deUint64)
               (this->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        }
      }
    }
    result = (*vk->_vptr_DeviceInterface[0xc])
                       (vk,device,
                        (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
                        .m_internal,(((Allocation *)VVar12.m_internal)->m_memory).m_internal,
                        ((Allocation *)VVar12.m_internal)->m_offset);
    ::vk::checkResult(result,
                      "vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x1b4);
    puVar3 = (undefined8 *)
             ((this->m_allocation).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    *puVar3 = 6;
    *(deInt32 *)(puVar3 + 1) = dVar1;
    *(undefined4 *)((long)puVar3 + 0xc) = 10;
    pAVar4 = (this->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)(pAVar4->m_memory).m_internal,pAVar4->m_offset,0x10);
    bufferDescriptorInfo.buffer.m_internal =
         (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    bufferDescriptorInfo.offset = 0;
    bufferDescriptorInfo.range = 0x10;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&samplerParams);
    pDVar11 = (DescriptorSetUpdateBuilder *)
              ::vk::DescriptorSetUpdateBuilder::write
                        ((DescriptorSetUpdateBuilder *)&samplerParams,
                         (int)(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>
                              .m_data.object.m_internal,(void *)0x0,0);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar11,vk,device);
    if (samplerParams._48_8_ != 0) {
      operator_delete((void *)samplerParams._48_8_,samplerParams._64_8_ - samplerParams._48_8_);
    }
    if (samplerParams._24_8_ != 0) {
      operator_delete((void *)samplerParams._24_8_,samplerParams._40_8_ - samplerParams._24_8_);
    }
    this_00 = &samplerParams;
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)this_00);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,*cmdBuffer,0,pipelineLayout->m_internal,0,1,&this->m_descriptorSet,0,0);
  return;
}

Assistant:

void VaryingOutputCountTestInstance::bindDescriptorSets (const DeviceInterface& vk, const VkDevice device, Allocator& memAlloc,
														 const VkCommandBuffer& cmdBuffer, const VkPipelineLayout& pipelineLayout)
{
	if (m_test == READ_UNIFORM)
	{
		const deInt32				emitCount[4]		= { 6, 0, m_maxEmitCount, 10 };
		const VkBufferCreateInfo	bufferCreateInfo	= makeBufferCreateInfo(sizeof(emitCount), VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
		m_buffer										= createBuffer(vk, device, &bufferCreateInfo);
		m_allocation									= memAlloc.allocate(getBufferMemoryRequirements(vk, device, *m_buffer), MemoryRequirement::HostVisible);

		VK_CHECK(vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset()));
		{
			deMemcpy(m_allocation->getHostPtr(), &emitCount[0], sizeof(emitCount));
			flushMappedMemoryRange(vk, device, m_allocation->getMemory(), m_allocation->getOffset(), sizeof(emitCount));

			const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*m_buffer, 0ull, sizeof(emitCount));

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &bufferDescriptorInfo)
				.update(vk, device);
			vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout, 0u, 1u, &*m_descriptorSet, 0u, DE_NULL);
		}
	}
	else if (m_test == READ_TEXTURE)
	{
		const tcu::TextureFormat	texFormat			= glu::mapGLInternalFormat(GL_RGBA8);
		const VkFormat				format				= mapTextureFormat(texFormat);
		const VkSamplerCreateInfo	samplerParams		=
														{
															VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,		// VkStructureType			sType;
															DE_NULL,									// const void*				pNext;
															0u,											// VkSamplerCreateFlags		flags;
															VK_FILTER_NEAREST,							// VkFilter					magFilter;
															VK_FILTER_NEAREST,							// VkFilter					minFilter;
															VK_SAMPLER_MIPMAP_MODE_NEAREST,				// VkSamplerMipmapMode		mipmapMode;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeU;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeV;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeW;
															0.0f,										// float					mipLodBias;
															VK_FALSE,									// VkBool32					anisotropyEnable;
															1.0f,										// float					maxAnisotropy;
															false,										// VkBool32					compareEnable;
															VK_COMPARE_OP_NEVER,						// VkCompareOp				compareOp;
															0.0f,										// float					minLod;
															0.0f,										// float					maxLod;
															VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK,	// VkBorderColor			borderColor;
															false										// VkBool32					unnormalizedCoordinates;
														};
		m_sampler										= createSampler(vk, device, &samplerParams);
		const VkImageViewCreateInfo	viewParams			=
														{
															VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType			sType;
															NULL,										// const voide*				pNext;
															0u,											// VkImageViewCreateFlags	flags;
															*m_texture,									// VkImage					image;
															VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType			viewType;
															format,										// VkFormat					format;
															makeComponentMappingRGBA(),					// VkChannelMapping			channels;
															{
																VK_IMAGE_ASPECT_COLOR_BIT,				// VkImageAspectFlags	aspectMask;
																0u,										// deUint32				baseMipLevel;
																1u,										// deUint32				mipLevels;
																0,										// deUint32				baseArraySlice;
																1u										// deUint32				arraySize;
															},											// VkImageSubresourceRange	subresourceRange;
														};
		m_imageView										= createImageView(vk, device, &viewParams);
		const VkDescriptorImageInfo descriptorImageInfo = makeDescriptorImageInfo (*m_sampler, *m_imageView, VK_IMAGE_LAYOUT_GENERAL);
		DescriptorSetUpdateBuilder()
			.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &descriptorImageInfo)
			.update(vk, device);
		vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout, 0u, 1u, &*m_descriptorSet, 0u, DE_NULL);
	}
}